

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

bool __thiscall imrt::ApertureILS::perturbate(ApertureILS *this,int no_improvement,int iteration)

{
  return (bool)(no_improvement == 100 & this->do_perturbate);
}

Assistant:

bool ApertureILS::perturbate(int no_improvement, int iteration) {
  if (!do_perturbate) return(false);
  //if (no_improvement >= ((double) iteration)*0.3) {  
  //  return(true);
  //}
  if (no_improvement==100) return(true);
    return(false);
}